

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

uint64_t fdb_set_file_header(fdb_kvs_handle *handle,bool inc_revnum)

{
  filemgr_magic_t fVar1;
  char *pcVar2;
  long lVar3;
  filemgr *pfVar4;
  bool bVar5;
  uint32_t uVar6;
  size_t *psVar7;
  uint64_t uVar8;
  size_t sVar9;
  undefined8 uStack_90;
  undefined8 uStack_88;
  ulong local_80;
  kvs_stat stat;
  filemgr *cur_file;
  size_t offset;
  uint64_t _edn_safe_64;
  uint32_t crc;
  uint16_t _edn_safe_16;
  uint16_t old_filename_len;
  uint16_t new_filename_len;
  uint8_t *buf;
  bool inc_revnum_local;
  fdb_kvs_handle *handle_local;
  
  lVar3 = -((ulong)(handle->config).blocksize + 0xf & 0xfffffffffffffff0);
  psVar7 = (size_t *)((long)&uStack_88 + lVar3);
  crc._2_2_ = 0;
  crc._0_2_ = 0;
  stat.deltasize = (int64_t)handle->file;
  *psVar7 = handle->trie->root_bid >> 0x38 | (handle->trie->root_bid & 0xff000000000000) >> 0x28 |
            (handle->trie->root_bid & 0xff0000000000) >> 0x18 |
            (handle->trie->root_bid & 0xff00000000) >> 8 |
            (handle->trie->root_bid & 0xff000000) << 8 | (handle->trie->root_bid & 0xff0000) << 0x18
            | (handle->trie->root_bid & 0xff00) << 0x28 | handle->trie->root_bid << 0x38;
  if ((handle->config).seqtree_opt == '\x01') {
    *(bid_t *)((long)&local_80 + lVar3) =
         ((handle->field_6).seqtree)->root_bid >> 0x38 |
         (((handle->field_6).seqtree)->root_bid & 0xff000000000000) >> 0x28 |
         (((handle->field_6).seqtree)->root_bid & 0xff0000000000) >> 0x18 |
         (((handle->field_6).seqtree)->root_bid & 0xff00000000) >> 8 |
         (((handle->field_6).seqtree)->root_bid & 0xff000000) << 8 |
         (((handle->field_6).seqtree)->root_bid & 0xff0000) << 0x18 |
         (((handle->field_6).seqtree)->root_bid & 0xff00) << 0x28 |
         ((handle->field_6).seqtree)->root_bid << 0x38;
  }
  else {
    *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13f3aa;
    memset((void *)((long)&local_80 + lVar3),0xff,8);
  }
  cur_file = (filemgr *)0x10;
  fVar1 = handle->file->version;
  *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13f3ca;
  bVar5 = ver_staletree_support(fVar1);
  if (bVar5) {
    *(bid_t *)((long)&stat + lVar3) =
         handle->staletree->root_bid >> 0x38 |
         (handle->staletree->root_bid & 0xff000000000000) >> 0x28 |
         (handle->staletree->root_bid & 0xff0000000000) >> 0x18 |
         (handle->staletree->root_bid & 0xff00000000) >> 8 |
         (handle->staletree->root_bid & 0xff000000) << 8 |
         (handle->staletree->root_bid & 0xff0000) << 0x18 |
         (handle->staletree->root_bid & 0xff00) << 0x28 | handle->staletree->root_bid << 0x38;
    cur_file = (filemgr *)0x18;
  }
  *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13f4e0;
  _kvs_stat_get(*(filemgr **)((long)&stat + lVar3 + 8),*(fdb_kvs_id_t *)((long)&stat + lVar3),
                *(kvs_stat **)((long)&local_80 + lVar3));
  *(uint64_t *)((long)psVar7 + (long)cur_file) =
       stat.nlivenodes >> 0x38 | (stat.nlivenodes & 0xff000000000000) >> 0x28 |
       (stat.nlivenodes & 0xff0000000000) >> 0x18 | (stat.nlivenodes & 0xff00000000) >> 8 |
       (stat.nlivenodes & 0xff000000) << 8 | (stat.nlivenodes & 0xff0000) << 0x18 |
       (stat.nlivenodes & 0xff00) << 0x28 | stat.nlivenodes << 0x38;
  fVar1 = handle->file->version;
  *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13f5b0;
  bVar5 = ver_is_atleast_magic_001(fVar1);
  pfVar4 = (filemgr *)&cur_file->ref_count;
  if (bVar5) {
    *(uint64_t *)((long)psVar7 + (long)&cur_file->ref_count) =
         stat.ndocs >> 0x38 | (stat.ndocs & 0xff000000000000) >> 0x28 |
         (stat.ndocs & 0xff0000000000) >> 0x18 | (stat.ndocs & 0xff00000000) >> 8 |
         (stat.ndocs & 0xff000000) << 8 | (stat.ndocs & 0xff0000) << 0x18 |
         (stat.ndocs & 0xff00) << 0x28 | stat.ndocs << 0x38;
    pfVar4 = (filemgr *)&cur_file->blocksize;
  }
  cur_file = pfVar4;
  *(ulong *)((long)psVar7 + (long)cur_file) =
       local_80 >> 0x38 | (local_80 & 0xff000000000000) >> 0x28 |
       (local_80 & 0xff0000000000) >> 0x18 | (local_80 & 0xff00000000) >> 8 |
       (local_80 & 0xff000000) << 8 | (local_80 & 0xff0000) << 0x18 | (local_80 & 0xff00) << 0x28 |
       local_80 << 0x38;
  *(uint64_t *)((long)psVar7 + (long)&cur_file->ref_count) =
       stat.ndeletes >> 0x38 | (stat.ndeletes & 0xff000000000000) >> 0x28 |
       (stat.ndeletes & 0xff0000000000) >> 0x18 | (stat.ndeletes & 0xff00000000) >> 8 |
       (stat.ndeletes & 0xff000000) << 8 | (stat.ndeletes & 0xff0000) << 0x18 |
       (stat.ndeletes & 0xff00) << 0x28 | stat.ndeletes << 0x38;
  *(uint64_t *)((long)psVar7 + (long)&cur_file->blocksize) =
       handle->last_wal_flush_hdr_bid >> 0x38 |
       (handle->last_wal_flush_hdr_bid & 0xff000000000000) >> 0x28 |
       (handle->last_wal_flush_hdr_bid & 0xff0000000000) >> 0x18 |
       (handle->last_wal_flush_hdr_bid & 0xff00000000) >> 8 |
       (handle->last_wal_flush_hdr_bid & 0xff000000) << 8 |
       (handle->last_wal_flush_hdr_bid & 0xff0000) << 0x18 |
       (handle->last_wal_flush_hdr_bid & 0xff00) << 0x28 | handle->last_wal_flush_hdr_bid << 0x38;
  *(uint64_t *)((long)psVar7 + (long)&cur_file->pos) =
       handle->kv_info_offset >> 0x38 | (handle->kv_info_offset & 0xff000000000000) >> 0x28 |
       (handle->kv_info_offset & 0xff0000000000) >> 0x18 |
       (handle->kv_info_offset & 0xff00000000) >> 8 | (handle->kv_info_offset & 0xff000000) << 8 |
       (handle->kv_info_offset & 0xff0000) << 0x18 | (handle->kv_info_offset & 0xff00) << 0x28 |
       handle->kv_info_offset << 0x38;
  *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13f9de;
  uVar8 = _fdb_export_header_flags(*(fdb_kvs_handle **)((long)&local_80 + lVar3));
  *(uint64_t *)((long)psVar7 + (long)&cur_file->latest_filesize) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  if (handle->file->new_filename != (char *)0x0) {
    pcVar2 = handle->file->new_filename;
    *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13fac4;
    sVar9 = strlen(pcVar2);
    crc._2_2_ = (short)sVar9 + 1;
  }
  *(ushort *)((long)psVar7 + (long)&cur_file->last_commit) = crc._2_2_ >> 8 | crc._2_2_ << 8;
  if (handle->file->old_filename != (char *)0x0) {
    pcVar2 = handle->file->old_filename;
    *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13fb2f;
    sVar9 = strlen(pcVar2);
    crc._0_2_ = (short)sVar9 + 1;
  }
  *(ushort *)
   ((long)psVar7 +
   (long)((long)&(cur_file->last_commit).super___atomic_base<unsigned_long>._M_i + 2)) =
       (ushort)crc >> 8 | (ushort)crc << 8;
  cur_file = (filemgr *)((long)&(cur_file->last_commit).super___atomic_base<unsigned_long>._M_i + 4)
  ;
  if (crc._2_2_ != 0) {
    pcVar2 = handle->file->new_filename;
    *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13fb9d;
    memcpy((void *)((long)psVar7 + (long)cur_file),pcVar2,(ulong)crc._2_2_);
    cur_file = (filemgr *)((long)&cur_file->filename + (ulong)crc._2_2_);
  }
  if ((ushort)crc != 0) {
    pcVar2 = handle->file->old_filename;
    *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13fbd2;
    memcpy((void *)((long)psVar7 + (long)cur_file),pcVar2,(ulong)(ushort)crc);
    cur_file = (filemgr *)((long)&cur_file->filename + (ulong)(ushort)crc);
  }
  *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13fbf9;
  uVar6 = get_checksum(*(uint8_t **)((long)&local_80 + lVar3),*psVar7,
                       *(crc_mode_e *)((long)&uStack_90 + lVar3 + 4));
  *(uint32_t *)((long)psVar7 + (long)cur_file) =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  *(undefined8 *)((long)&uStack_90 + lVar3) = 0x13fc6d;
  uVar8 = filemgr_update_header
                    (*(filemgr **)((long)&stat + lVar3 + 8),*(void **)((long)&stat + lVar3),
                     *(size_t *)((long)&local_80 + lVar3),*(bool *)((long)&uStack_88 + lVar3 + 7));
  return uVar8;
}

Assistant:

uint64_t fdb_set_file_header(fdb_kvs_handle *handle, bool inc_revnum)
{
    /*
    <ForestDB header>
    [offset]: (description)
    [     0]: BID of root node of root B+Tree of HB+Trie: 8 bytes
    [     8]: BID of root node of seq B+Tree: 8 bytes (0xFF.. if not used)
    [    16]: BID of root node of stale block B+Tree: 8 bytes (since V3)
    [    24]: # of live documents: 8 bytes
    [    32]: # of deleted documents: 8 bytes (version specific)
    [    40]: # of live B+Tree nodes: 8 bytes
    [    48]: Data size (byte): 8 bytes
    [    56]: BID of the DB header created when last WAL flush: 8 bytes
    [    64]: Offset of the document containing KV instances' info: 8 bytes
    [    72]: Header flags: 8 bytes
    [    80]: Size of newly compacted target file name : 2 bytes
    [    82]: Size of old file name before compaction :  2 bytes
    [    84]: File name of newly compacted file : x bytes
    [  84+x]: File name of old file before compcation : y bytes
    [84+x+y]: CRC32: 4 bytes
    total size (header's length): 88+x+y bytes

    Note: the list of functions that need to be modified
          if the header structure is changed:

        fdb_fetch_header() and associated callers in forestdb.cc
        ver_get_new_filename_off() in version.cc
        _fdb_redirect_header() in forestdb.cc
        filemgr_destroy_file() in filemgr.cc
        print_header() in dump_common.cc
        decode_dblock() and dblock in forestdb_hexamine.cc
        fdb_get_reusable_block() in staleblock.cc
    */

    uint8_t *buf = alca(uint8_t, handle->config.blocksize);
    uint16_t new_filename_len = 0;
    uint16_t old_filename_len = 0;
    uint16_t _edn_safe_16;
    uint32_t crc;
    uint64_t _edn_safe_64;
    size_t offset = 0;
    struct filemgr *cur_file;
    struct kvs_stat stat;

    cur_file = handle->file;

    // hb+trie or idtree root bid
    _edn_safe_64 = _endian_encode(handle->trie->root_bid);
    seq_memcpy(buf + offset, &_edn_safe_64, sizeof(handle->trie->root_bid), offset);

    if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
        // b+tree root bid
        _edn_safe_64 = _endian_encode(handle->seqtree->root_bid);
        seq_memcpy(buf + offset, &_edn_safe_64,
            sizeof(handle->seqtree->root_bid), offset);
    } else {
        memset(buf + offset, 0xff, sizeof(uint64_t));
        offset += sizeof(uint64_t);
    }

    // stale block tree root bid (MAGIC_002)
    if (ver_staletree_support(handle->file->version)) {
        _edn_safe_64 = _endian_encode(handle->staletree->root_bid);
        seq_memcpy(buf + offset, &_edn_safe_64,
                   sizeof(handle->staletree->root_bid), offset);
    }

    // get stat
    _kvs_stat_get(cur_file, 0, &stat);

    // # docs
    _edn_safe_64 = _endian_encode(stat.ndocs);
    seq_memcpy(buf + offset, &_edn_safe_64, sizeof(_edn_safe_64), offset);

    // # deleted docs (since MAGIC_001)
    if (ver_is_atleast_magic_001(handle->file->version)) {
        _edn_safe_64 = _endian_encode(stat.ndeletes);
        seq_memcpy(buf + offset, &_edn_safe_64, sizeof(_edn_safe_64), offset);
    }

    // # live nodes
    _edn_safe_64 = _endian_encode(stat.nlivenodes);
    seq_memcpy(buf + offset, &_edn_safe_64,
               sizeof(_edn_safe_64), offset);
    // data size
    _edn_safe_64 = _endian_encode(stat.datasize);
    seq_memcpy(buf + offset, &_edn_safe_64, sizeof(_edn_safe_64), offset);

    // last header bid
    _edn_safe_64 = _endian_encode(handle->last_wal_flush_hdr_bid);
    seq_memcpy(buf + offset, &_edn_safe_64,
               sizeof(handle->last_wal_flush_hdr_bid), offset);
    // kv info offset
    _edn_safe_64 = _endian_encode(handle->kv_info_offset);
    seq_memcpy(buf + offset, &_edn_safe_64,
               sizeof(handle->kv_info_offset), offset);
    // header flags
    _edn_safe_64 = _fdb_export_header_flags(handle);
    _edn_safe_64 = _endian_encode(_edn_safe_64);
    seq_memcpy(buf + offset, &_edn_safe_64,
               sizeof(_edn_safe_64), offset);

    // size of newly compacted target file name
    if (handle->file->new_filename) {
        new_filename_len = strlen(handle->file->new_filename) + 1;
    }
    _edn_safe_16 = _endian_encode(new_filename_len);
    seq_memcpy(buf + offset, &_edn_safe_16, sizeof(new_filename_len), offset);

    // size of old filename before compaction
    if (handle->file->old_filename) {
        old_filename_len = strlen(handle->file->old_filename) + 1;
    }
    _edn_safe_16 = _endian_encode(old_filename_len);
    seq_memcpy(buf + offset, &_edn_safe_16, sizeof(old_filename_len), offset);

    if (new_filename_len) {
        seq_memcpy(buf + offset, handle->file->new_filename,
                   new_filename_len, offset);
    }

    if (old_filename_len) {
        seq_memcpy(buf + offset, handle->file->old_filename,
                   old_filename_len, offset);
    }

    // crc32
    crc = get_checksum(buf, offset, handle->file->crc_mode);
    crc = _endian_encode(crc);
    seq_memcpy(buf + offset, &crc, sizeof(crc), offset);

    return filemgr_update_header(handle->file, buf, offset, inc_revnum);
}